

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int aec_decode_enable_offsets(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  vector_t *vec;
  int iVar2;
  
  piVar1 = strm->state;
  iVar2 = -5;
  if (piVar1->offsets == (vector_t *)0x0) {
    iVar2 = 0;
    vec = vector_create();
    piVar1->offsets = vec;
    vector_push_back(vec,0);
  }
  return iVar2;
}

Assistant:

int aec_decode_enable_offsets(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    if (state->offsets != NULL) {
        return AEC_RSI_OFFSETS_ERROR;
    }
    state->offsets = vector_create();
    vector_push_back(state->offsets, 0);
    return AEC_OK;
}